

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O0

void depthsbits_create(stagewise_poly *poly)

{
  uchar *puVar1;
  size_t sVar2;
  undefined8 *in_RDI;
  uint64_t i;
  size_t in_stack_000001b8;
  ulong local_10;
  
  vw::length((vw *)*in_RDI);
  puVar1 = calloc_or_throw<unsigned_char>(in_stack_000001b8);
  in_RDI[5] = puVar1;
  local_10 = 0;
  while( true ) {
    sVar2 = vw::length((vw *)*in_RDI);
    if (sVar2 << 1 <= local_10) break;
    *(undefined1 *)(in_RDI[5] + local_10) = 0x7f;
    *(undefined1 *)(in_RDI[5] + 1 + local_10) = 0x80;
    local_10 = local_10 + 2;
  }
  return;
}

Assistant:

void depthsbits_create(stagewise_poly &poly)
{
  poly.depthsbits = calloc_or_throw<uint8_t>(2 * poly.all->length());
  for (uint64_t i = 0; i < poly.all->length() * 2; i += 2)
  {
    poly.depthsbits[i] = default_depth;
    poly.depthsbits[i + 1] = indicator_bit;
  }
}